

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::
rehash(Data<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_> *this,
      size_t sizeHint)

{
  pair<QObject_*,_QByteArray> *key;
  ulong uVar1;
  Span *pSVar2;
  Entry *pEVar3;
  char *pcVar4;
  qsizetype qVar5;
  ulong uVar6;
  QHashMultiReturnType<QObject_*,_QByteArray> hash;
  Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*> *pNVar7;
  ulong uVar8;
  size_t index;
  long lVar9;
  Span *pSVar10;
  size_t numBuckets;
  uchar *args_1;
  long lVar11;
  R_conflict9 RVar12;
  Bucket BVar13;
  
  if (sizeHint == 0) {
    sizeHint = this->size;
  }
  numBuckets = 0x80;
  if ((0x40 < sizeHint) && (numBuckets = 0xffffffffffffffff, sizeHint >> 0x3e == 0)) {
    lVar9 = 0x3f;
    if (sizeHint != 0) {
      for (; sizeHint >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    numBuckets = 1L << (0x41 - ((byte)lVar9 ^ 0x3f) & 0x3f);
  }
  uVar1 = this->numBuckets;
  pSVar2 = this->spans;
  RVar12 = allocateSpans(numBuckets);
  this->spans = (Span *)RVar12.spans;
  this->numBuckets = numBuckets;
  if (uVar1 < 0x80) {
    if (pSVar2 == (Span *)0x0) {
      return;
    }
  }
  else {
    uVar8 = 0;
    pSVar10 = pSVar2;
    do {
      lVar9 = 0;
      do {
        uVar6 = (ulong)pSVar10->offsets[lVar9];
        if (uVar6 != 0xff) {
          pEVar3 = pSVar2[uVar8].entries;
          key = (pair<QObject_*,_QByteArray> *)(pEVar3 + uVar6);
          pEVar3 = pEVar3 + uVar6;
          args_1 = (pEVar3->storage).data + 8;
          hash = qHashMulti<QObject*,QByteArray>(this->seed,(QObject **)key,(QByteArray *)args_1);
          BVar13 = Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>::
                   findBucketWithHash<std::pair<QObject*,QByteArray>>
                             ((Data<QHashPrivate::Node<std::pair<QObject*,QByteArray>,QPropertyAnimation*>>
                               *)this,key,hash);
          pNVar7 = Span<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                   ::insert(BVar13.span,BVar13.index);
          (pNVar7->key).first = *(QObject **)(pEVar3->storage).data;
          args_1[0] = '\0';
          args_1[1] = '\0';
          args_1[2] = '\0';
          args_1[3] = '\0';
          args_1[4] = '\0';
          args_1[5] = '\0';
          args_1[6] = '\0';
          args_1[7] = '\0';
          (pNVar7->key).second.d.d = *(Data **)args_1;
          pcVar4 = *(char **)((pEVar3->storage).data + 0x10);
          (pEVar3->storage).data[0x10] = '\0';
          (pEVar3->storage).data[0x11] = '\0';
          (pEVar3->storage).data[0x12] = '\0';
          (pEVar3->storage).data[0x13] = '\0';
          (pEVar3->storage).data[0x14] = '\0';
          (pEVar3->storage).data[0x15] = '\0';
          (pEVar3->storage).data[0x16] = '\0';
          (pEVar3->storage).data[0x17] = '\0';
          (pNVar7->key).second.d.ptr = pcVar4;
          qVar5 = *(qsizetype *)((pEVar3->storage).data + 0x18);
          (pEVar3->storage).data[0x18] = '\0';
          (pEVar3->storage).data[0x19] = '\0';
          (pEVar3->storage).data[0x1a] = '\0';
          (pEVar3->storage).data[0x1b] = '\0';
          (pEVar3->storage).data[0x1c] = '\0';
          (pEVar3->storage).data[0x1d] = '\0';
          (pEVar3->storage).data[0x1e] = '\0';
          (pEVar3->storage).data[0x1f] = '\0';
          (pNVar7->key).second.d.size = qVar5;
          pNVar7->value = *(QPropertyAnimation **)((pEVar3->storage).data + 0x20);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 != 0x80);
      Span<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::freeData
                (pSVar2 + uVar8);
      uVar8 = uVar8 + 1;
      pSVar10 = pSVar10 + 1;
    } while (uVar8 != uVar1 >> 7);
  }
  lVar9 = *(long *)&pSVar2[-1].allocated;
  if (lVar9 != 0) {
    lVar11 = lVar9 * 0x90;
    do {
      Span<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>::freeData
                ((Span<QHashPrivate::Node<std::pair<QObject_*,_QByteArray>,_QPropertyAnimation_*>_>
                  *)(pSVar2[-1].offsets + lVar11));
      lVar11 = lVar11 + -0x90;
    } while (lVar11 != 0);
  }
  operator_delete__(&pSVar2[-1].allocated,lVar9 * 0x90 + 8);
  return;
}

Assistant:

void rehash(size_t sizeHint = 0)
    {
        if (sizeHint == 0)
            sizeHint = size;
        size_t newBucketCount = GrowthPolicy::bucketsForCapacity(sizeHint);

        Span *oldSpans = spans;
        size_t oldBucketCount = numBuckets;
        spans = allocateSpans(newBucketCount).spans;
        numBuckets = newBucketCount;
        size_t oldNSpans = oldBucketCount >> SpanConstants::SpanShift;

        for (size_t s = 0; s < oldNSpans; ++s) {
            Span &span = oldSpans[s];
            for (size_t index = 0; index < SpanConstants::NEntries; ++index) {
                if (!span.hasNode(index))
                    continue;
                Node &n = span.at(index);
                auto it = findBucket(n.key);
                Q_ASSERT(it.isUnused());
                Node *newNode = it.insert();
                new (newNode) Node(std::move(n));
            }
            span.freeData();
        }
        delete[] oldSpans;
    }